

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall spdlog::details::registry::flush_every(registry *this,seconds interval)

{
  mutex_type *in_RDI;
  function<void_()> clbk;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  _Bind<void_(spdlog::details::registry::*(spdlog::details::registry_*))()>
  *in_stack_ffffffffffffff88;
  function<void_()> *in_stack_ffffffffffffff90;
  code *__args_1;
  function<void_()> *__args;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_RDI);
  __args_1 = flush_all;
  __args = (function<void_()> *)0x0;
  std::bind<void(spdlog::details::registry::*)(),spdlog::details::registry*>
            (&in_stack_ffffffffffffff88->_M_f,(registry **)in_stack_ffffffffffffff80);
  std::function<void()>::
  function<std::_Bind<void(spdlog::details::registry::*(spdlog::details::registry*))()>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::
  make_unique<spdlog::details::periodic_worker,std::function<void()>&,std::chrono::duration<long,std::ratio<1l,1l>>&>
            (__args,(duration<long,_std::ratio<1L,_1L>_> *)__args_1);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::operator=((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
               *)in_stack_ffffffffffffff80,
              (unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
               *)in_RDI);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::~unique_ptr((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
                 *)in_stack_ffffffffffffff80);
  std::function<void_()>::~function((function<void_()> *)0x1d1b62);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d1b6c);
  return;
}

Assistant:

SPDLOG_INLINE void registry::flush_every(std::chrono::seconds interval)
{
    std::lock_guard<std::mutex> lock(flusher_mutex_);
    std::function<void()> clbk = std::bind(&registry::flush_all, this);
    periodic_flusher_ = details::make_unique<periodic_worker>(clbk, interval);
}